

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportLpRowVectors(HighsLogOptions *log_options,HighsLp *lp)

{
  value_type vVar1;
  uint uVar2;
  int iVar3;
  HighsLogOptions *pHVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  uint *puVar9;
  undefined8 uVar10;
  int *in_RSI;
  HighsLogOptions *in_RDI;
  string name;
  HighsInt iRow;
  HighsInt el;
  bool have_row_names;
  vector<int,_std::allocator<int>_> count;
  string type;
  HighsLogOptions *in_stack_ffffffffffffff10;
  value_type_conflict2 *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  allocator *paVar11;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [36];
  uint local_64;
  int local_60;
  undefined4 local_50;
  byte local_49;
  vector<int,_std::allocator<int>_> local_48;
  string local_30 [32];
  int *local_10;
  HighsLogOptions *local_8;
  
  if (0 < in_RSI[1]) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    std::__cxx11::string::string(local_30);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4fe4a9);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_10 + 0x58));
    local_49 = sVar5 != 0;
    local_50 = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    if (0 < *local_10) {
      for (local_60 = 0; iVar3 = local_60,
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)*local_10
                             ), iVar3 < *pvVar6; local_60 = local_60 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x30),(long)local_60);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)*pvVar6);
        *pvVar7 = *pvVar7 + 1;
      }
    }
    highsLogUser(local_8,kInfo,"     Row        Lower        Upper       Type        Count");
    if ((local_49 & 1) != 0) {
      highsLogUser(local_8,kInfo,"  Name");
    }
    highsLogUser(local_8,kInfo,"\n");
    for (local_64 = 0; (int)local_64 < local_10[1]; local_64 = local_64 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),(long)(int)local_64);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),(long)(int)local_64);
      getBoundType_abi_cxx11_((double)in_stack_ffffffffffffff28,(double)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff28 = local_88;
      std::__cxx11::string::operator=(local_30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(in_stack_ffffffffffffff28);
      paVar11 = &local_a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"",paVar11);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      pHVar4 = local_8;
      uVar2 = local_64;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                          (long)(int)local_64);
      in_stack_ffffffffffffff10 = (HighsLogOptions *)*pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                          (long)(int)local_64);
      vVar1 = *pvVar8;
      in_stack_ffffffffffffff20 = (value_type_conflict2 *)std::__cxx11::string::c_str();
      puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_48,(long)(int)local_64);
      highsLogUser(in_stack_ffffffffffffff10,(HighsLogType)vVar1,(char *)pHVar4,1,
                   "%8d %12g %12g         %2s %12d",(ulong)uVar2,in_stack_ffffffffffffff20,
                   (ulong)*puVar9);
      pHVar4 = local_8;
      if ((local_49 & 1) != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_10 + 0x58),(long)(int)local_64);
        uVar10 = std::__cxx11::string::c_str();
        highsLogUser(pHVar4,kInfo,"  %-s",uVar10);
      }
      highsLogUser(local_8,kInfo,"\n");
      std::__cxx11::string::~string(local_a8);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void reportLpRowVectors(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.num_row_ <= 0) return;
  std::string type;
  vector<HighsInt> count;
  bool have_row_names = (lp.row_names_.size() != 0);

  count.resize(lp.num_row_, 0);
  if (lp.num_col_ > 0) {
    for (HighsInt el = 0; el < lp.a_matrix_.start_[lp.num_col_]; el++)
      count[lp.a_matrix_.index_[el]]++;
  }

  highsLogUser(log_options, HighsLogType::kInfo,
               "     Row        Lower        Upper       Type        Count");
  if (have_row_names) highsLogUser(log_options, HighsLogType::kInfo, "  Name");
  highsLogUser(log_options, HighsLogType::kInfo, "\n");

  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    type = getBoundType(lp.row_lower_[iRow], lp.row_upper_[iRow]);
    std::string name = "";
    highsLogUser(log_options, HighsLogType::kInfo,
                 "%8" HIGHSINT_FORMAT
                 " %12g %12g         %2s %12" HIGHSINT_FORMAT "",
                 iRow, lp.row_lower_[iRow], lp.row_upper_[iRow], type.c_str(),
                 count[iRow]);
    if (have_row_names)
      highsLogUser(log_options, HighsLogType::kInfo, "  %-s",
                   lp.row_names_[iRow].c_str());
    highsLogUser(log_options, HighsLogType::kInfo, "\n");
  }
}